

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O2

void __thiscall adios2::format::BP5Serializer::BP5Serializer(BP5Serializer *this)

{
  BP5Base::BP5Base((BP5Base *)&this->field_0x150);
  this->_vptr_BP5Serializer = (_func_int **)&VTT;
  this->m_Engine = (Engine *)0x0;
  this->m_StatsLevel = 1;
  this->m_PreMetaMetadataFileLength = 0;
  this->m_BufferAlign = 1;
  this->m_BufferBlockSize = 0x20;
  this->GenericAttributeFormat = (FMFormat)0x0;
  (this->NewStructFormats).super__Vector_base<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->NewStructFormats).super__Vector_base<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->NewStructFormats).super__Vector_base<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->DeferredExterns).
  super__Vector_base<adios2::format::BP5Serializer::DeferredExtern,_std::allocator<adios2::format::BP5Serializer::DeferredExtern>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->DeferredExterns).
  super__Vector_base<adios2::format::BP5Serializer::DeferredExtern,_std::allocator<adios2::format::BP5Serializer::DeferredExtern>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->DeferredExterns).
  super__Vector_base<adios2::format::BP5Serializer::DeferredExtern,_std::allocator<adios2::format::BP5Serializer::DeferredExtern>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->DefSpanMinMax).
  super__Vector_base<adios2::format::BP5Serializer::DeferredSpanMinMax,_std::allocator<adios2::format::BP5Serializer::DeferredSpanMinMax>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->DefSpanMinMax).
  super__Vector_base<adios2::format::BP5Serializer::DeferredSpanMinMax,_std::allocator<adios2::format::BP5Serializer::DeferredSpanMinMax>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->DefSpanMinMax).
  super__Vector_base<adios2::format::BP5Serializer::DeferredSpanMinMax,_std::allocator<adios2::format::BP5Serializer::DeferredSpanMinMax>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->PendingAttrs = (BP5AttrStruct *)0x0;
  FFSWriterMarshalBase::FFSWriterMarshalBase(&this->Info);
  this->MetadataBuf = (void *)0x0;
  this->NewAttribute = false;
  this->MetadataSize = 0;
  this->CurDataBuffer = (BufferV *)0x0;
  (this->PreviousMetaMetaInfoBlocks).
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->PreviousMetaMetaInfoBlocks).
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->PreviousMetaMetaInfoBlocks).
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_PriorDataBufferSizeTotal = 0;
  Init(this);
  return;
}

Assistant:

BP5Serializer::BP5Serializer() { Init(); }